

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefSite.h
# Opt level: O2

bool __thiscall
dg::dda::GenericDefSite<dg::dda::RWNode>::operator<
          (GenericDefSite<dg::dda::RWNode> *this,GenericDefSite<dg::dda::RWNode> *oth)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  bVar3 = this->target < oth->target;
  if ((this->target == oth->target) &&
     (uVar1 = (oth->offset).offset, uVar2 = (this->offset).offset, bVar3 = uVar2 < uVar1,
     uVar2 == uVar1)) {
    bVar3 = (this->len).offset < (oth->len).offset;
  }
  return bVar3;
}

Assistant:

bool operator<(const GenericDefSite &oth) const {
        return target == oth.target
                       ? (offset == oth.offset ? len < oth.len
                                               : offset < oth.offset)
                       : target < oth.target;
    }